

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_temporary_files.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBTemporaryFilesInit(ClientContext *context,TableFunctionInitInput *input)

{
  BufferManager *pBVar1;
  pointer pDVar2;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::DuckDBTemporaryFilesData_*,_false> local_60;
  vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  local_58;
  vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  local_38;
  
  local_60._M_head_impl = (DuckDBTemporaryFilesData *)operator_new(0x28);
  *(undefined ***)
   &(((element_type *)local_60._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
    __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__DuckDBTemporaryFilesData_019b3978;
  (((element_type *)local_60._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
  __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((element_type *)local_60._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  (((element_type *)local_60._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&((element_type *)local_60._M_head_impl)->interrupted = 0;
  pBVar1 = BufferManager::GetBufferManager((ClientContext *)input);
  (*pBVar1->_vptr_BufferManager[0x1a])(&local_58,pBVar1);
  pDVar2 = unique_ptr<duckdb::DuckDBTemporaryFilesData,_std::default_delete<duckdb::DuckDBTemporaryFilesData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBTemporaryFilesData,_std::default_delete<duckdb::DuckDBTemporaryFilesData>,_true>
                         *)&local_60);
  local_38.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pDVar2->entries).
       super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       .
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pDVar2->entries).
       super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       .
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pDVar2->entries).
       super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       .
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pDVar2->entries).
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar2->entries).
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar2->entries).
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ::~vector(&local_38);
  ::std::vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ::~vector(&local_58);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_60._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBTemporaryFilesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBTemporaryFilesData>();

	result->entries = BufferManager::GetBufferManager(context).GetTemporaryFiles();
	return std::move(result);
}